

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O0

vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_> *
__thiscall
program_options::command_line_parser::parse_terminator
          (command_line_parser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  value_type *__x;
  value_type *pvVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  *in_RDI;
  option opt;
  uint i;
  string *tok;
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  *result;
  char *in_stack_ffffffffffffff38;
  basic_option<char> *in_stack_ffffffffffffff40;
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  *this_00;
  undefined1 local_70 [112];
  
  local_70[0x57] = 0;
  this_00 = in_RDI;
  local_70._88_8_ = in_RDX;
  std::
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  ::vector((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
            *)0x200669);
  local_70._72_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_70._88_8_,0);
  bVar1 = std::operator==(&in_stack_ffffffffffffff40->string_key,in_stack_ffffffffffffff38);
  if (bVar1) {
    local_70._56_4_ = 1;
    while( true ) {
      __x = (value_type *)(ulong)(uint)local_70._56_4_;
      pvVar2 = (value_type *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_70._88_8_);
      if (pvVar2 <= __x) break;
      basic_option<char>::basic_option(in_stack_ffffffffffffff40);
      in_stack_ffffffffffffff40 = (basic_option<char> *)local_70;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70._88_8_,(ulong)(uint)local_70._56_4_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00,&__x->string_key);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70._88_8_,(ulong)(uint)local_70._56_4_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00,&__x->string_key);
      std::
      vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
      ::push_back(this_00,__x);
      basic_option<char>::~basic_option(in_stack_ffffffffffffff40);
      local_70._56_4_ = local_70._56_4_ + 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x2007c2);
  }
  return in_RDI;
}

Assistant:

std::vector<option>
command_line_parser::parse_terminator(std::vector<std::string>& args)
{
    std::vector<option> result;
    const std::string& tok = args[0];
    if (tok == "--")
    {
        for(unsigned i = 1; i < args.size(); ++i)
        {
            option opt;
            opt.value.push_back(args[i]);
            opt.original_tokens.push_back(args[i]);
            opt.position_key = INT_MAX;
            result.push_back(opt);
        }
        args.clear();
    }
    return result;
}